

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_k_means_test.cc
# Opt level: O3

void __thiscall
AV1Kmeans::AV1KmeansTest2_DISABLED_Speed_Test::TestBody(AV1KmeansTest2_DISABLED_Speed_Test *this)

{
  av1_calc_indices_dim2_func p_Var1;
  ParamType *pPVar2;
  
  pPVar2 = testing::
           WithParamInterface<std::tuple<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int),_BLOCK_SIZE>_>
           ::GetParam();
  p_Var1 = (av1_calc_indices_dim2_func)
           (pPVar2->
           super__Tuple_impl<0UL,_void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int),_BLOCK_SIZE>
           ).
           super__Head_base<0UL,_void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int),_false>
           ._M_head_impl;
  pPVar2 = testing::
           WithParamInterface<std::tuple<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int),_BLOCK_SIZE>_>
           ::GetParam();
  AV1KmeansTest2::RunSpeedTest
            (&this->super_AV1KmeansTest2,p_Var1,
             (pPVar2->
             super__Tuple_impl<0UL,_void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int),_BLOCK_SIZE>
             ).super__Tuple_impl<1UL,_BLOCK_SIZE>.super__Head_base<1UL,_BLOCK_SIZE,_false>.
             _M_head_impl,2);
  pPVar2 = testing::
           WithParamInterface<std::tuple<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int),_BLOCK_SIZE>_>
           ::GetParam();
  p_Var1 = (av1_calc_indices_dim2_func)
           (pPVar2->
           super__Tuple_impl<0UL,_void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int),_BLOCK_SIZE>
           ).
           super__Head_base<0UL,_void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int),_false>
           ._M_head_impl;
  pPVar2 = testing::
           WithParamInterface<std::tuple<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int),_BLOCK_SIZE>_>
           ::GetParam();
  AV1KmeansTest2::RunSpeedTest
            (&this->super_AV1KmeansTest2,p_Var1,
             (pPVar2->
             super__Tuple_impl<0UL,_void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int),_BLOCK_SIZE>
             ).super__Tuple_impl<1UL,_BLOCK_SIZE>.super__Head_base<1UL,_BLOCK_SIZE,_false>.
             _M_head_impl,3);
  pPVar2 = testing::
           WithParamInterface<std::tuple<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int),_BLOCK_SIZE>_>
           ::GetParam();
  p_Var1 = (av1_calc_indices_dim2_func)
           (pPVar2->
           super__Tuple_impl<0UL,_void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int),_BLOCK_SIZE>
           ).
           super__Head_base<0UL,_void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int),_false>
           ._M_head_impl;
  pPVar2 = testing::
           WithParamInterface<std::tuple<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int),_BLOCK_SIZE>_>
           ::GetParam();
  AV1KmeansTest2::RunSpeedTest
            (&this->super_AV1KmeansTest2,p_Var1,
             (pPVar2->
             super__Tuple_impl<0UL,_void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int),_BLOCK_SIZE>
             ).super__Tuple_impl<1UL,_BLOCK_SIZE>.super__Head_base<1UL,_BLOCK_SIZE,_false>.
             _M_head_impl,4);
  pPVar2 = testing::
           WithParamInterface<std::tuple<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int),_BLOCK_SIZE>_>
           ::GetParam();
  p_Var1 = (av1_calc_indices_dim2_func)
           (pPVar2->
           super__Tuple_impl<0UL,_void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int),_BLOCK_SIZE>
           ).
           super__Head_base<0UL,_void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int),_false>
           ._M_head_impl;
  pPVar2 = testing::
           WithParamInterface<std::tuple<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int),_BLOCK_SIZE>_>
           ::GetParam();
  AV1KmeansTest2::RunSpeedTest
            (&this->super_AV1KmeansTest2,p_Var1,
             (pPVar2->
             super__Tuple_impl<0UL,_void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int),_BLOCK_SIZE>
             ).super__Tuple_impl<1UL,_BLOCK_SIZE>.super__Head_base<1UL,_BLOCK_SIZE,_false>.
             _M_head_impl,5);
  pPVar2 = testing::
           WithParamInterface<std::tuple<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int),_BLOCK_SIZE>_>
           ::GetParam();
  p_Var1 = (av1_calc_indices_dim2_func)
           (pPVar2->
           super__Tuple_impl<0UL,_void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int),_BLOCK_SIZE>
           ).
           super__Head_base<0UL,_void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int),_false>
           ._M_head_impl;
  pPVar2 = testing::
           WithParamInterface<std::tuple<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int),_BLOCK_SIZE>_>
           ::GetParam();
  AV1KmeansTest2::RunSpeedTest
            (&this->super_AV1KmeansTest2,p_Var1,
             (pPVar2->
             super__Tuple_impl<0UL,_void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int),_BLOCK_SIZE>
             ).super__Tuple_impl<1UL,_BLOCK_SIZE>.super__Head_base<1UL,_BLOCK_SIZE,_false>.
             _M_head_impl,6);
  pPVar2 = testing::
           WithParamInterface<std::tuple<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int),_BLOCK_SIZE>_>
           ::GetParam();
  p_Var1 = (av1_calc_indices_dim2_func)
           (pPVar2->
           super__Tuple_impl<0UL,_void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int),_BLOCK_SIZE>
           ).
           super__Head_base<0UL,_void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int),_false>
           ._M_head_impl;
  pPVar2 = testing::
           WithParamInterface<std::tuple<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int),_BLOCK_SIZE>_>
           ::GetParam();
  AV1KmeansTest2::RunSpeedTest
            (&this->super_AV1KmeansTest2,p_Var1,
             (pPVar2->
             super__Tuple_impl<0UL,_void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int),_BLOCK_SIZE>
             ).super__Tuple_impl<1UL,_BLOCK_SIZE>.super__Head_base<1UL,_BLOCK_SIZE,_false>.
             _M_head_impl,7);
  pPVar2 = testing::
           WithParamInterface<std::tuple<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int),_BLOCK_SIZE>_>
           ::GetParam();
  p_Var1 = (av1_calc_indices_dim2_func)
           (pPVar2->
           super__Tuple_impl<0UL,_void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int),_BLOCK_SIZE>
           ).
           super__Head_base<0UL,_void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int),_false>
           ._M_head_impl;
  pPVar2 = testing::
           WithParamInterface<std::tuple<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int),_BLOCK_SIZE>_>
           ::GetParam();
  AV1KmeansTest2::RunSpeedTest
            (&this->super_AV1KmeansTest2,p_Var1,
             (pPVar2->
             super__Tuple_impl<0UL,_void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int),_BLOCK_SIZE>
             ).super__Tuple_impl<1UL,_BLOCK_SIZE>.super__Head_base<1UL,_BLOCK_SIZE,_false>.
             _M_head_impl,8);
  return;
}

Assistant:

TEST_P(AV1KmeansTest2, DISABLED_Speed) {
  RunSpeedTest(GET_PARAM(0), GET_PARAM(1), 2);
  RunSpeedTest(GET_PARAM(0), GET_PARAM(1), 3);
  RunSpeedTest(GET_PARAM(0), GET_PARAM(1), 4);
  RunSpeedTest(GET_PARAM(0), GET_PARAM(1), 5);
  RunSpeedTest(GET_PARAM(0), GET_PARAM(1), 6);
  RunSpeedTest(GET_PARAM(0), GET_PARAM(1), 7);
  RunSpeedTest(GET_PARAM(0), GET_PARAM(1), 8);
}